

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

void __thiscall Centaurus::ATNPath::parse(ATNPath *this,Stream *stream)

{
  wchar_t wVar1;
  int iVar2;
  StreamException *pSVar3;
  int local_80;
  int local_7c;
  undefined1 local_78 [4];
  int index;
  wstring index_str;
  wchar_t local_44;
  undefined1 local_40 [4];
  wchar_t ch;
  Identifier id;
  Stream *stream_local;
  ATNPath *this_local;
  
  id.m_id.field_2._8_8_ = stream;
  do {
    Identifier::Identifier((Identifier *)local_40,(Stream *)id.m_id.field_2._8_8_);
    wVar1 = Stream::get((Stream *)id.m_id.field_2._8_8_);
    if (wVar1 != L'.') {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar3,(Stream *)id.m_id.field_2._8_8_,wVar1);
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    std::__cxx11::wstring::wstring((wstring *)local_78);
    wVar1 = Stream::get((Stream *)id.m_id.field_2._8_8_);
    iVar2 = iswdigit(wVar1);
    if (iVar2 == 0) {
      pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(pSVar3,(Stream *)id.m_id.field_2._8_8_,wVar1);
      __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
    }
    std::__cxx11::wstring::push_back((wchar_t)local_78);
    local_44 = Stream::peek((Stream *)id.m_id.field_2._8_8_);
    while (iVar2 = iswdigit(local_44), iVar2 != 0) {
      std::__cxx11::wstring::push_back((wchar_t)local_78);
      Stream::discard((Stream *)id.m_id.field_2._8_8_);
      local_44 = Stream::peek((Stream *)id.m_id.field_2._8_8_);
    }
    local_7c = std::__cxx11::stoi((wstring *)local_78,(size_t *)0x0,10);
    std::
    vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
    ::emplace_back<Centaurus::Identifier&,int&>
              ((vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>
                *)&this->
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ,(Identifier *)local_40,&local_7c);
    wVar1 = Stream::get((Stream *)id.m_id.field_2._8_8_);
    if (wVar1 == L'\0') {
      local_80 = 3;
    }
    else {
      if (wVar1 != L'/') {
        pSVar3 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar3,(Stream *)id.m_id.field_2._8_8_,wVar1);
        __cxa_throw(pSVar3,&StreamException::typeinfo,StreamException::~StreamException);
      }
      local_80 = 0;
    }
    std::__cxx11::wstring::~wstring((wstring *)local_78);
    Identifier::~Identifier((Identifier *)local_40);
  } while (local_80 == 0);
  return;
}

Assistant:

void ATNPath::parse(Stream& stream)
{
    while (true)
    {
        Identifier id(stream);

        wchar_t ch = stream.get();
        if (ch != L'.')
            throw stream.unexpected(ch);

        std::wstring index_str;
        ch = stream.get();
        if (!iswdigit(ch))
            throw stream.unexpected(ch);

        index_str.push_back(ch);

        for (ch = stream.peek(); iswdigit(ch); ch = stream.peek())
        {
            index_str.push_back(ch);
            stream.discard();
        }

        int index = std::stoi(index_str);

        emplace_back(id, index);

        ch = stream.get();
        if (ch == L'\0')
            break;
        else if (ch != L'/')
            throw stream.unexpected(ch);
    }
}